

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void test_mp_nthroot(void)

{
  mp_int *r;
  mp_int *remainder_out;
  size_t sVar1;
  mp_int *x;
  ulong uVar2;
  uint8_t sizes [1];
  byte local_29;
  
  r = mp_new(0x100);
  remainder_out = mp_new(0x100);
  sVar1 = (*looplimit)(0x20);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      random_read(&local_29,1);
      mp_random_bits_into(r,(ulong)local_29);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      x = mp_nthroot(r,3,remainder_out);
      mp_free(x);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(0x20);
    } while (uVar2 < sVar1);
  }
  mp_free(r);
  mp_free(remainder_out);
  return;
}

Assistant:

static void test_mp_nthroot(void)
{
    mp_int *x = mp_new(256), *remainder = mp_new(256);

    for (size_t i = 0; i < looplimit(32); i++) {
        uint8_t sizes[1];
        random_read(sizes, 1);
        mp_random_bits_into(x, sizes[0]);
        log_start();
        mp_free(mp_nthroot(x, 3, remainder));
        log_end();
    }

    mp_free(x);
    mp_free(remainder);
}